

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter_test.cc
# Opt level: O3

void __thiscall
prometheus::anon_unknown_0::CounterTest_reset_Test::~CounterTest_reset_Test
          (CounterTest_reset_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(CounterTest, reset) {
  Counter counter;
  counter.Increment();
  counter.Reset();
  EXPECT_EQ(counter.Value(), 0.0);
  counter.Increment(5);
  counter.Increment();
  EXPECT_EQ(counter.Value(), 6.0);
}